

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.hpp
# Opt level: O1

void __thiscall pstore::repo::section_content::~section_content(section_content *this)

{
  pointer peVar1;
  pointer piVar2;
  pointer puVar3;
  
  peVar1 = (this->xfixups).
           super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (peVar1 != (pointer)0x0) {
    operator_delete(peVar1,(long)(this->xfixups).
                                 super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)peVar1);
  }
  piVar2 = (this->ifixups).
           super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->ifixups).
                                 super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  puVar3 = (this->data).big_buffer_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->data).big_buffer_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
    return;
  }
  return;
}

Assistant:

explicit section_content (section_kind const kind_) noexcept
                    : kind{kind_} {}